

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O0

void RGBA32PackedToPlanar_16b_SSE2(uint16_t *rgbx,__m128i *r,__m128i *g,__m128i *b)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined2 *in_RCX;
  undefined2 *in_RDX;
  undefined2 *in_RSI;
  undefined8 *in_RDI;
  __m128i in3;
  __m128i in2;
  __m128i in1;
  __m128i in0;
  undefined2 local_148;
  undefined2 uStack_146;
  undefined2 uStack_144;
  undefined2 local_138;
  undefined2 uStack_136;
  undefined2 uStack_134;
  undefined2 local_128;
  undefined2 uStack_126;
  undefined2 uStack_124;
  undefined2 local_118;
  undefined2 uStack_116;
  undefined2 uStack_114;
  undefined2 uStack_c0;
  undefined2 uStack_be;
  undefined2 uStack_bc;
  undefined2 uStack_b0;
  undefined2 uStack_ae;
  undefined2 uStack_ac;
  undefined2 uStack_a0;
  undefined2 uStack_9e;
  undefined2 uStack_9c;
  undefined2 uStack_90;
  undefined2 uStack_8e;
  undefined2 uStack_8c;
  __m128i B3;
  __m128i B2;
  __m128i B1;
  __m128i B0;
  __m128i A3;
  __m128i A2;
  __m128i A1;
  __m128i A0;
  
  uVar1 = *in_RDI;
  uVar2 = in_RDI[1];
  uVar3 = in_RDI[2];
  uVar4 = in_RDI[3];
  uVar5 = in_RDI[4];
  uVar6 = in_RDI[5];
  uVar7 = in_RDI[6];
  uVar8 = in_RDI[7];
  local_118 = (undefined2)uVar1;
  uStack_116 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_114 = (undefined2)((ulong)uVar1 >> 0x20);
  local_128 = (undefined2)uVar3;
  uStack_126 = (undefined2)((ulong)uVar3 >> 0x10);
  uStack_124 = (undefined2)((ulong)uVar3 >> 0x20);
  uStack_90 = (undefined2)uVar2;
  uStack_8e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_8c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_a0 = (undefined2)uVar4;
  uStack_9e = (undefined2)((ulong)uVar4 >> 0x10);
  uStack_9c = (undefined2)((ulong)uVar4 >> 0x20);
  local_138 = (undefined2)uVar5;
  uStack_136 = (undefined2)((ulong)uVar5 >> 0x10);
  uStack_134 = (undefined2)((ulong)uVar5 >> 0x20);
  local_148 = (undefined2)uVar7;
  uStack_146 = (undefined2)((ulong)uVar7 >> 0x10);
  uStack_144 = (undefined2)((ulong)uVar7 >> 0x20);
  uStack_b0 = (undefined2)uVar6;
  uStack_ae = (undefined2)((ulong)uVar6 >> 0x10);
  uStack_ac = (undefined2)((ulong)uVar6 >> 0x20);
  uStack_c0 = (undefined2)uVar8;
  uStack_be = (undefined2)((ulong)uVar8 >> 0x10);
  uStack_bc = (undefined2)((ulong)uVar8 >> 0x20);
  *in_RSI = local_118;
  in_RSI[1] = uStack_90;
  in_RSI[2] = local_128;
  in_RSI[3] = uStack_a0;
  in_RSI[4] = local_138;
  in_RSI[5] = uStack_b0;
  in_RSI[6] = local_148;
  in_RSI[7] = uStack_c0;
  *in_RDX = uStack_116;
  in_RDX[1] = uStack_8e;
  in_RDX[2] = uStack_126;
  in_RDX[3] = uStack_9e;
  in_RDX[4] = uStack_136;
  in_RDX[5] = uStack_ae;
  in_RDX[6] = uStack_146;
  in_RDX[7] = uStack_be;
  *in_RCX = uStack_114;
  in_RCX[1] = uStack_8c;
  in_RCX[2] = uStack_124;
  in_RCX[3] = uStack_9c;
  in_RCX[4] = uStack_134;
  in_RCX[5] = uStack_ac;
  in_RCX[6] = uStack_144;
  in_RCX[7] = uStack_bc;
  return;
}

Assistant:

static WEBP_INLINE void RGBA32PackedToPlanar_16b_SSE2(
    const uint16_t* const rgbx,
    __m128i* const r, __m128i* const g, __m128i* const b) {
  const __m128i in0 = LOAD_16(rgbx +  0);  // r0 | g0 | b0 |x| r1 | g1 | b1 |x
  const __m128i in1 = LOAD_16(rgbx +  8);  // r2 | g2 | b2 |x| r3 | g3 | b3 |x
  const __m128i in2 = LOAD_16(rgbx + 16);  // r4 | ...
  const __m128i in3 = LOAD_16(rgbx + 24);  // r6 | ...
  // column-wise transpose
  const __m128i A0 = _mm_unpacklo_epi16(in0, in1);
  const __m128i A1 = _mm_unpackhi_epi16(in0, in1);
  const __m128i A2 = _mm_unpacklo_epi16(in2, in3);
  const __m128i A3 = _mm_unpackhi_epi16(in2, in3);
  const __m128i B0 = _mm_unpacklo_epi16(A0, A1);  // r0 r1 r2 r3 | g0 g1 ..
  const __m128i B1 = _mm_unpackhi_epi16(A0, A1);  // b0 b1 b2 b3 | x x x x
  const __m128i B2 = _mm_unpacklo_epi16(A2, A3);  // r4 r5 r6 r7 | g4 g5 ..
  const __m128i B3 = _mm_unpackhi_epi16(A2, A3);  // b4 b5 b6 b7 | x x x x
  *r = _mm_unpacklo_epi64(B0, B2);
  *g = _mm_unpackhi_epi64(B0, B2);
  *b = _mm_unpacklo_epi64(B1, B3);
}